

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxminddb-compat-util.h
# Opt level: O0

void * mmdb_memmem(void *l,size_t l_len,void *s,size_t s_len)

{
  int iVar1;
  char *cs;
  char *cl;
  char *last;
  char *cur;
  size_t s_len_local;
  void *s_local;
  size_t l_len_local;
  void *l_local;
  
  if ((l_len == 0) || (s_len == 0)) {
    l_local = (void *)0x0;
  }
  else if (l_len < s_len) {
    l_local = (void *)0x0;
  }
  else if (s_len == 1) {
    l_local = memchr(l,(int)*s,l_len);
  }
  else {
    for (last = (char *)l; last <= (char *)((long)l + (l_len - s_len)); last = last + 1) {
      if ((*last == *s) && (iVar1 = memcmp(last,s,s_len), iVar1 == 0)) {
        return last;
      }
    }
    l_local = (void *)0x0;
  }
  return l_local;
}

Assistant:

static const void *
mmdb_memmem(const void *l, size_t l_len, const void *s, size_t s_len) {
    const char *cur, *last;
    const char *cl = (const char *)l;
    const char *cs = (const char *)s;

    /* we need something to compare */
    if (l_len == 0 || s_len == 0)
        return NULL;

    /* "s" must be smaller or equal to "l" */
    if (l_len < s_len)
        return NULL;

    /* special case where s_len == 1 */
    if (s_len == 1)
        return memchr(l, (int)*cs, l_len);

    /* the last position where its possible to find "s" in "l" */
    last = cl + l_len - s_len;

    for (cur = cl; cur <= last; cur++)
        if (cur[0] == cs[0] && memcmp(cur, cs, s_len) == 0)
            return cur;

    return NULL;
}